

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_net_pton.c
# Opt level: O2

int ares_inet_net_pton_ipv4(char *src,uchar *dst,size_t size)

{
  byte c;
  byte bVar1;
  void *pvVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  uchar *puVar11;
  bool bVar12;
  
  memset(dst,0,size);
  pbVar10 = (byte *)(src + 1);
  bVar1 = *src;
  iVar7 = 2;
  puVar11 = dst;
  if (bVar1 == 0x30) {
    if ((((*pbVar10 | 0x20) == 0x78) && (c = src[2], -1 < (char)c)) &&
       (((byte)(c - 0x30) < 10 ||
        ((c - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(c - 0x41) & 0x3f) & 1) != 0)))))) {
      if (size == 0) {
        iVar7 = 0x5a;
        goto LAB_0011909a;
      }
      uVar4 = 0;
      bVar12 = false;
      pbVar10 = (byte *)(src + 3);
      while (uVar8 = (uint)(char)c, '\0' < (char)c) {
        if (9 < (byte)(c - 0x30)) {
          if (5 < (byte)((c & 0x5f) + 0xbf)) break;
          if (c < 0x5b) {
            bVar1 = ares_tolower(c);
            uVar8 = (uint)bVar1;
          }
        }
        pvVar2 = memchr("0123456789abcdef",uVar8,0x11);
        uVar8 = (int)pvVar2 - 0x127910;
        uVar4 = uVar4 << 4 | uVar8;
        if (bVar12) {
          if (size == 0) goto LAB_001190de;
          size = size - 1;
          *puVar11 = (uchar)uVar4;
          puVar11 = puVar11 + 1;
          bVar12 = false;
        }
        else {
          bVar12 = true;
          uVar4 = uVar8;
        }
        c = *pbVar10;
        pbVar10 = pbVar10 + 1;
      }
      if (bVar12) {
        if (size == 0) {
LAB_001190de:
          iVar7 = 0x5a;
          goto LAB_0011909a;
        }
        size = size - 1;
        *puVar11 = (char)uVar4 << 4;
        puVar11 = puVar11 + 1;
      }
LAB_00119101:
      iVar7 = 2;
      if (uVar8 == 0) {
        if (puVar11 == dst) goto LAB_0011909a;
LAB_0011918d:
        bVar1 = *dst;
        if (bVar1 < 0xf0) {
          if (bVar1 < 0xe0) {
            if (bVar1 < 0xc0) {
              uVar4 = (uint)(bVar1 >> 7) * 8 + 8;
            }
            else {
              uVar4 = 0x18;
            }
          }
          else {
            uVar4 = 8;
          }
        }
        else {
          uVar4 = 0x20;
        }
        lVar5 = ((long)puVar11 - (long)dst) * 8;
        uVar8 = (int)((long)puVar11 - (long)dst) << 3;
        if (lVar5 - (ulong)uVar4 == 0 || lVar5 < (long)(ulong)uVar4) {
          uVar8 = uVar4;
        }
        if (uVar8 == 8) {
          uVar8 = (uint)(bVar1 != 0xe0) * 4 + 4;
        }
      }
      else {
        if (((uVar8 != 0x2f) || (bVar1 = *pbVar10, 9 < (byte)(bVar1 - 0x30))) || (puVar11 <= dst))
        goto LAB_0011909a;
        uVar8 = 0;
        do {
          pbVar10 = pbVar10 + 1;
          pvVar2 = memchr("0123456789",(uint)bVar1,0xb);
          uVar8 = uVar8 * 10 + (int)pvVar2 + -0x127921;
          if (0x20 < (int)uVar8) goto LAB_00119096;
          bVar1 = *pbVar10;
        } while ((byte)(bVar1 - 0x30) < 10);
        iVar7 = 2;
        if (bVar1 != 0) goto LAB_0011909a;
        if (uVar8 == 0xffffffff) goto LAB_0011918d;
      }
      iVar7 = 0x5a;
      lVar5 = (long)puVar11 * 8 + (long)dst * -8;
      sVar6 = 0;
      while( true ) {
        if ((int)uVar8 <= lVar5) {
          return uVar8;
        }
        if (size == sVar6) break;
        puVar11[sVar6] = '\0';
        sVar6 = sVar6 + 1;
        lVar5 = lVar5 + 8;
      }
      goto LAB_0011909a;
    }
  }
  else if (9 < (byte)(bVar1 - 0x30)) goto LAB_0011909a;
  do {
    uVar8 = (uint)bVar1;
    iVar7 = 0;
    do {
      pbVar9 = pbVar10;
      pvVar2 = memchr("0123456789",uVar8,0xb);
      iVar7 = iVar7 * 10 + (int)pvVar2 + -0x127921;
      if (0xff < iVar7) goto LAB_00119096;
      bVar1 = *pbVar9;
      uVar8 = (uint)(char)bVar1;
      pbVar10 = pbVar9 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
    bVar12 = size == 0;
    size = size - 1;
    if (bVar12) goto LAB_001190de;
    *puVar11 = (uchar)iVar7;
    puVar11 = puVar11 + 1;
    if (bVar1 != 0x2e) {
      iVar7 = 2;
      if ((bVar1 == 0) || (bVar1 == 0x2f)) goto LAB_00119101;
      goto LAB_0011909a;
    }
    bVar1 = *pbVar10;
    pbVar10 = pbVar9 + 2;
  } while ((byte)(bVar1 - 0x30) < 10);
LAB_00119096:
  iVar7 = 2;
LAB_0011909a:
  piVar3 = __errno_location();
  *piVar3 = iVar7;
  return -1;
}

Assistant:

static int ares_inet_net_pton_ipv4(const char *src, unsigned char *dst,
                                   size_t size)
{
  static const char    xdigits[] = "0123456789abcdef";
  static const char    digits[]  = "0123456789";
  int                  n;
  int                  ch;
  int                  tmp = 0;
  int                  dirty;
  int                  bits;
  const unsigned char *odst = dst;

  memset(dst, 0, size);
  ch = *src++;
  if (ch == '0' && (src[0] == 'x' || src[0] == 'X') && ares_isascii(src[1]) &&
      ares_isxdigit(src[1])) {
    /* Hexadecimal: Eat nybble string. */
    if (!size) {
      goto emsgsize;
    }
    dirty = 0;
    src++; /* skip x or X. */
    while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isxdigit(ch)) {
      if (ares_isupper(ch)) {
        ch = ares_tolower((unsigned char)ch);
      }
      n = (int)(strchr(xdigits, ch) - xdigits);
      if (dirty == 0) {
        tmp = n;
      } else {
        tmp = (tmp << 4) | n;
      }
      if (++dirty == 2) {
        if (!size--) {
          goto emsgsize;
        }
        *dst++ = (unsigned char)tmp;
        dirty  = 0;
      }
    }
    if (dirty) { /* Odd trailing nybble? */
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)(tmp << 4);
    }
  } else if (ares_isascii(ch) && ares_isdigit(ch)) {
    /* Decimal: eat dotted digit string. */
    for (;;) {
      tmp = 0;
      do {
        n    = (int)(strchr(digits, ch) - digits);
        tmp *= 10;
        tmp += n;
        if (tmp > 255) {
          goto enoent;
        }
      } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)tmp;
      if (ch == '\0' || ch == '/') {
        break;
      }
      if (ch != '.') {
        goto enoent;
      }
      ch = *src++;
      if (!ares_isascii(ch) || !ares_isdigit(ch)) {
        goto enoent;
      }
    }
  } else {
    goto enoent;
  }

  bits = -1;
  if (ch == '/' && ares_isascii(src[0]) && ares_isdigit(src[0]) && dst > odst) {
    /* CIDR width specifier.  Nothing can follow it. */
    ch   = *src++; /* Skip over the /. */
    bits = 0;
    do {
      n     = (int)(strchr(digits, ch) - digits);
      bits *= 10;
      bits += n;
      if (bits > 32) {
        goto enoent;
      }
    } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
    if (ch != '\0') {
      goto enoent;
    }
  }

  /* Firey death and destruction unless we prefetched EOS. */
  if (ch != '\0') {
    goto enoent;
  }

  /* If nothing was written to the destination, we found no address. */
  if (dst == odst) {
    goto enoent; /* LCOV_EXCL_LINE: all valid paths above increment dst */
  }
  /* If no CIDR spec was given, infer width from net class. */
  if (bits == -1) {
    if (*odst >= 240) {        /* Class E */
      bits = 32;
    } else if (*odst >= 224) { /* Class D */
      bits = 8;
    } else if (*odst >= 192) { /* Class C */
      bits = 24;
    } else if (*odst >= 128) { /* Class B */
      bits = 16;
    } else {                   /* Class A */
      bits = 8;
    }
    /* If imputed mask is narrower than specified octets, widen. */
    if (bits < ((dst - odst) * 8)) {
      bits = (int)(dst - odst) * 8;
    }
    /*
     * If there are no additional bits specified for a class D
     * address adjust bits to 4.
     */
    if (bits == 8 && *odst == 224) {
      bits = 4;
    }
  }
  /* Extend network to cover the actual mask. */
  while (bits > ((dst - odst) * 8)) {
    if (!size--) {
      goto emsgsize;
    }
    *dst++ = '\0';
  }
  return bits;

enoent:
  SET_SOCKERRNO(ENOENT);
  return -1;

emsgsize:
  SET_SOCKERRNO(EMSGSIZE);
  return -1;
}